

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

bool operator==(Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
                *lhs,Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
                     *rhs)

{
  uint uVar1;
  uint uVar2;
  size_t local_28;
  size_t i;
  Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
  *rhs_local;
  Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
  *lhs_local;
  
  local_28 = 0;
  while( true ) {
    if (local_28 == 0x56f) {
      return true;
    }
    uVar1 = Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
            ::compute(lhs,local_28);
    uVar2 = Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
            ::compute(rhs,local_28);
    if (uVar1 != uVar2) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool operator==(const Well& lhs, const Well& rhs)
    {
        for (std::size_t i = 0; i != state_size; ++i)
            if (lhs.compute(i) != rhs.compute(i))
                return false;

        return true;
    }